

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxratiotester.h
# Opt level: O0

void __thiscall
soplex::
SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setDelta(SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *newDelta)

{
  type_conflict5 tVar1;
  element_type *peVar2;
  long in_RDI;
  double unaff_retaddr;
  cpp_dec_float<100U,_int,_void> *in_stack_00000008;
  SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffff48;
  cpp_dec_float<100U,_int,_void> *in_stack_ffffffffffffff50;
  Real local_68 [5];
  Real local_40;
  long local_20;
  Real *local_18;
  long local_10;
  Real *local_8;
  
  tolerances(in_stack_ffffffffffffff48);
  peVar2 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x5dc7e2);
  local_40 = Tolerances::epsilon(peVar2);
  tVar1 = boost::multiprecision::operator<=
                    ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)in_stack_ffffffffffffff48,(double *)0x5dc80d);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x5dc81d);
  if (tVar1) {
    tolerances(in_stack_ffffffffffffff48);
    peVar2 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x5dc848);
    local_68[0] = Tolerances::epsilon(peVar2);
    local_10 = in_RDI + 0x1c;
    local_18 = local_68;
    local_8 = local_18;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              (in_stack_00000008,unaff_retaddr);
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x5dc8b9);
  }
  else {
    local_20 = in_RDI + 0x1c;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              (in_stack_ffffffffffffff50,(cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffff48
              );
  }
  return;
}

Assistant:

virtual void setDelta(R newDelta)
   {
      if(newDelta <= this->tolerances()->epsilon())
         delta = this->tolerances()->epsilon();
      else
         delta = newDelta;
   }